

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O3

REF_STATUS ref_facelift_apply(REF_FACELIFT ref_facelift)

{
  REF_GEOM ref_geom;
  REF_DBL *pRVar1;
  uint uVar2;
  REF_INT *pRVar3;
  int iVar4;
  long lVar5;
  REF_STATUS RVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  REF_DBL xyz [3];
  double local_58;
  double local_50;
  double local_48;
  REF_NODE local_38;
  
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x1a2,"ref_facelift_apply","requires indirect facelift");
    RVar6 = 1;
  }
  else {
    ref_geom = ref_facelift->grid->geom;
    iVar4 = ref_geom->max;
    if (0 < iVar4) {
      local_38 = ref_facelift->grid->node;
      pRVar3 = ref_geom->descr;
      lVar8 = 0;
      lVar9 = 0;
      lVar7 = 0;
      do {
        if (*(int *)((long)pRVar3 + lVar9) == 2) {
          uVar2 = ref_egads_eval_at(ref_geom,2,*(REF_INT *)((long)pRVar3 + lVar9 + 4),
                                    (REF_DBL *)((long)ref_geom->param + lVar8),&local_58,
                                    (REF_DBL *)0x0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x1a7,"ref_facelift_apply",(ulong)uVar2,"eval at");
            return uVar2;
          }
          pRVar1 = ref_facelift->displacement;
          local_58 = *(double *)((long)pRVar1 + lVar9) + local_58;
          local_50 = *(double *)((long)pRVar1 + lVar9 + 8) + local_50;
          local_48 = *(double *)((long)pRVar1 + lVar9 + 0x10) + local_48;
          pRVar1 = local_38->real;
          pRVar3 = ref_geom->descr;
          lVar5 = (long)*(int *)((long)pRVar3 + lVar9 + 0x14);
          pRVar1[lVar5 * 0xf] = local_58;
          pRVar1[lVar5 * 0xf + 1] = local_50;
          pRVar1[lVar5 * 0xf + 2] = local_48;
          iVar4 = ref_geom->max;
        }
        lVar7 = lVar7 + 1;
        lVar9 = lVar9 + 0x18;
        lVar8 = lVar8 + 0x10;
      } while (lVar7 < iVar4);
    }
    RVar6 = 0;
  }
  return RVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_apply(REF_FACELIFT ref_facelift) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_NODE ref_node = ref_grid_node(ref_facelift_grid(ref_facelift));
  REF_DBL xyz[3];
  REF_INT geom;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  each_ref_geom_face(ref_geom, geom) {
    RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, ref_geom_id(ref_geom, geom),
                          &(ref_geom_param(ref_geom, 0, geom)), xyz, NULL),
        "eval at");
    xyz[0] += ref_facelift_displacement(ref_facelift, 0, geom);
    xyz[1] += ref_facelift_displacement(ref_facelift, 1, geom);
    xyz[2] += ref_facelift_displacement(ref_facelift, 2, geom);
    ref_node_xyz(ref_node, 0, ref_geom_node(ref_geom, geom)) = xyz[0];
    ref_node_xyz(ref_node, 1, ref_geom_node(ref_geom, geom)) = xyz[1];
    ref_node_xyz(ref_node, 2, ref_geom_node(ref_geom, geom)) = xyz[2];
  }
  return REF_SUCCESS;
}